

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

X509_EXTENSION * v3_generic_extension(char *ext,char *value,int crit,int gen_type,X509V3_CTX *ctx)

{
  bool bVar1;
  ASN1_OBJECT *pAVar2;
  uchar *puVar3;
  ASN1_OCTET_STRING *__p;
  pointer paVar4;
  pointer data;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_58;
  UniquePtr<ASN1_OCTET_STRING> oct;
  size_t ext_len;
  UniquePtr<unsigned_char> ext_der;
  unique_ptr<asn1_object_st,_bssl::internal::Deleter> local_38;
  UniquePtr<ASN1_OBJECT> obj;
  X509V3_CTX *ctx_local;
  int gen_type_local;
  int crit_local;
  char *value_local;
  char *ext_local;
  
  obj._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)ctx;
  pAVar2 = OBJ_txt2obj(ext,0);
  std::unique_ptr<asn1_object_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_object_st,bssl::internal::Deleter> *)&local_38,(pointer)pAVar2);
  bVar1 = std::operator==(&local_38,(nullptr_t)0x0);
  if (bVar1) {
    ERR_put_error(0x14,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                  ,0xe7);
    ERR_add_error_data(2,"name=",ext);
    ext_local = (char *)0x0;
    ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&ext_len);
    oct._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0;
    if (gen_type == 1) {
      puVar3 = x509v3_hex_to_bytes(value,(size_t *)&oct);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::reset
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len,puVar3);
    }
    else if (gen_type == 2) {
      puVar3 = generic_asn1(value,(X509V3_CTX *)
                                  obj._M_t.
                                  super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl,
                            (size_t *)&oct);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::reset
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len,puVar3);
    }
    bVar1 = std::operator==((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len,
                            (nullptr_t)0x0);
    if (bVar1) {
      ERR_put_error(0x14,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,0xf5);
      ERR_add_error_data(2,"value=",value);
      ext_local = (char *)0x0;
      ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
    }
    else if ((ulong)oct._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl < 0x80000000) {
      __p = ASN1_OCTET_STRING_new();
      std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&local_58,(pointer)__p);
      bVar1 = std::operator==(&local_58,(nullptr_t)0x0);
      if (bVar1) {
        ext_local = (char *)0x0;
      }
      else {
        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_58);
        data = std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::get
                         ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len);
        ASN1_STRING_set0((ASN1_STRING *)paVar4,data,
                         (int)oct._M_t.
                              super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::release
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len);
        pAVar2 = (ASN1_OBJECT *)
                 std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::get(&local_38);
        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_58);
        ext_local = (char *)X509_EXTENSION_create_by_OBJ
                                      ((X509_EXTENSION **)0x0,pAVar2,crit,
                                       (ASN1_OCTET_STRING *)paVar4);
      }
      ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
    }
    else {
      ERR_put_error(0x14,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,0xfb);
      ext_local = (char *)0x0;
      ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&ext_len);
  }
  std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return (X509_EXTENSION *)ext_local;
}

Assistant:

static X509_EXTENSION *v3_generic_extension(const char *ext, const char *value,
                                            int crit, int gen_type,
                                            const X509V3_CTX *ctx) {
  bssl::UniquePtr<ASN1_OBJECT> obj(OBJ_txt2obj(ext, 0));
  if (obj == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_NAME_ERROR);
    ERR_add_error_data(2, "name=", ext);
    return nullptr;
  }

  bssl::UniquePtr<unsigned char> ext_der;
  size_t ext_len = 0;
  if (gen_type == 1) {
    ext_der.reset(x509v3_hex_to_bytes(value, &ext_len));
  } else if (gen_type == 2) {
    ext_der.reset(generic_asn1(value, ctx, &ext_len));
  }

  if (ext_der == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_VALUE_ERROR);
    ERR_add_error_data(2, "value=", value);
    return nullptr;
  }

  if (ext_len > INT_MAX) {
    OPENSSL_PUT_ERROR(X509V3, ERR_R_OVERFLOW);
    return nullptr;
  }

  bssl::UniquePtr<ASN1_OCTET_STRING> oct(ASN1_OCTET_STRING_new());
  if (oct == nullptr) {
    return nullptr;
  }

  ASN1_STRING_set0(oct.get(), ext_der.get(), (int)ext_len);
  ext_der.release();  // ASN1_STRING_set0 took ownership.

  return X509_EXTENSION_create_by_OBJ(nullptr, obj.get(), crit, oct.get());
}